

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall ExecutionEngine::i_lneg(ExecutionEngine *this)

{
  VMStack *this_00;
  Frame *this_01;
  Value VVar1;
  undefined8 local_30;
  Value value_1;
  Frame *topFrame;
  VMStack *stackFrame;
  ExecutionEngine *this_local;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  VVar1 = Frame::popTopOfOperandStack(this_01);
  local_30._4_4_ = VVar1.type;
  if (local_30._4_4_ == LONG) {
    value_1._0_8_ = VVar1.data;
    local_30 = VVar1._0_8_;
    VVar1.data.longValue = -value_1._0_8_;
    VVar1.printType = (undefined4)local_30;
    VVar1.type = local_30._4_4_;
    Frame::pushIntoOperandStack(this_01,VVar1);
    this_01->pc = this_01->pc + 1;
    return;
  }
  __assert_fail("value_1.type == ValueType::LONG",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x921,"void ExecutionEngine::i_lneg()");
}

Assistant:

void ExecutionEngine::i_lneg() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();

	// Não precisa tirar o padding
    Value value_1 = topFrame->popTopOfOperandStack();
    assert(value_1.type == ValueType::LONG);

	value_1.data.longValue = -value_1.data.longValue;
    topFrame->pushIntoOperandStack(value_1);

    topFrame->pc += 1;
}